

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int test_full_callback(uint _progress)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_98 [2];
  basic_cstring<const_char> local_78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_68;
  assertion_result local_48;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  uint local_c;
  uint _progress_local;
  
  g_executed = true;
  local_c = _progress;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x1f6,&local_30);
    boost::test_tools::assertion_result::assertion_result(&local_48,g_prev_progress <= local_c);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_78,"_progress >= g_prev_progress",0x1c);
    boost::unit_test::operator<<(&local_68,prev,&local_78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_48,&local_68,local_98,0x1f6,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_68);
    boost::test_tools::assertion_result::~assertion_result(&local_48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  g_prev_progress = local_c;
  return 0;
}

Assistant:

static int test_full_callback(unsigned _progress)
{
	g_executed = true;
	BOOST_CHECK(_progress >= g_prev_progress);
	g_prev_progress = _progress;
	return 0;
}